

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O1

void __thiscall classSHA256::processChunk(classSHA256 *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t _temp_1;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint32_t _temp;
  uint32_t uVar16;
  uint uVar17;
  uint32_t uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint32_t _temp_3;
  uint32_t _temp_4;
  uint uVar24;
  uint32_t uVar25;
  
  lVar12 = 0;
  do {
    uVar1 = (this->state).w[lVar12];
    (this->state).w[lVar12] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  uVar2 = (this->state).h[0];
  uVar1 = (this->state).h[1];
  uVar3 = (this->state).h[2];
  uVar4 = (this->state).h[3];
  uVar5 = (this->state).h[4];
  uVar6 = (this->state).h[5];
  uVar7 = (this->state).h[6];
  uVar8 = (this->state).h[7];
  lVar12 = 0;
  uVar18 = uVar2;
  uVar17 = uVar1;
  uVar11 = uVar3;
  uVar22 = uVar4;
  uVar25 = uVar5;
  uVar24 = uVar6;
  uVar16 = uVar7;
  uVar20 = uVar8;
  do {
    uVar21 = uVar16;
    uVar16 = uVar24;
    uVar24 = uVar25;
    uVar23 = uVar11;
    uVar11 = uVar17;
    uVar17 = uVar18;
    iVar14 = ((uVar16 ^ uVar21) & uVar24 ^ uVar21) + uVar20 +
             ((uVar24 << 7 | uVar24 >> 0x19) ^
             (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) +
             *(int *)((long)processChunk::k + lVar12) + *(int *)((long)(this->state).w + lVar12);
    uVar25 = uVar22 + iVar14;
    uVar18 = (uVar11 & uVar23 ^ (uVar11 ^ uVar23) & uVar17) +
             ((uVar17 << 10 | uVar17 >> 0x16) ^
             (uVar17 << 0x13 | uVar17 >> 0xd) ^ (uVar17 << 0x1e | uVar17 >> 2)) + iVar14;
    lVar12 = lVar12 + 4;
    uVar22 = uVar23;
    uVar20 = uVar21;
  } while (lVar12 != 0x40);
  lVar12 = 0x1e;
  do {
    uVar19 = uVar16;
    uVar16 = uVar24;
    uVar24 = uVar25;
    uVar13 = uVar11;
    uVar11 = uVar17;
    uVar17 = uVar18;
    uVar10 = (uint)lVar12;
    uVar22 = (this->state).w[uVar10 - 0xd & 0xf];
    uVar9 = (this->state).w[uVar10 & 0xf];
    uVar15 = uVar10 - 0xe & 0xf;
    uVar18 = (uVar9 >> 10 ^ (uVar9 << 0xd | uVar9 >> 0x13) ^ (uVar9 << 0xf | uVar9 >> 0x11)) +
             (this->state).w[uVar10 - 5 & 0xf] + (this->state).w[uVar15] +
             (uVar22 >> 3 ^ (uVar22 << 0xe | uVar22 >> 0x12) ^ (uVar22 << 0x19 | uVar22 >> 7));
    (this->state).w[uVar15] = uVar18;
    iVar14 = ((uVar16 ^ uVar19) & uVar24 ^ uVar19) + uVar21 +
             ((uVar24 << 7 | uVar24 >> 0x19) ^
             (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) +
             *(int *)(&UNK_001f5338 + lVar12 * 4) + uVar18;
    uVar25 = uVar23 + iVar14;
    uVar18 = (uVar11 & uVar13 ^ (uVar11 ^ uVar13) & uVar17) +
             ((uVar17 << 10 | uVar17 >> 0x16) ^
             (uVar17 << 0x13 | uVar17 >> 0xd) ^ (uVar17 << 0x1e | uVar17 >> 2)) + iVar14;
    lVar12 = lVar12 + 1;
    uVar23 = uVar13;
    uVar21 = uVar19;
  } while (lVar12 != 0x4e);
  (this->state).h[0] = uVar18 + uVar2;
  (this->state).h[1] = uVar17 + uVar1;
  (this->state).h[2] = uVar11 + uVar3;
  (this->state).h[3] = uVar13 + uVar4;
  (this->state).h[4] = uVar25 + uVar5;
  (this->state).h[5] = uVar24 + uVar6;
  (this->state).h[6] = uVar16 + uVar7;
  (this->state).h[7] = uVar19 + uVar8;
  return;
}

Assistant:

void classSHA256::processChunk()
{
    // Round constants for SHA-256.
    static uint32_t const k[64] PROGMEM = {
        0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5,
        0x3956c25b, 0x59f111f1, 0x923f82a4, 0xab1c5ed5,
        0xd807aa98, 0x12835b01, 0x243185be, 0x550c7dc3,
        0x72be5d74, 0x80deb1fe, 0x9bdc06a7, 0xc19bf174,
        0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
        0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da,
        0x983e5152, 0xa831c66d, 0xb00327c8, 0xbf597fc7,
        0xc6e00bf3, 0xd5a79147, 0x06ca6351, 0x14292967,
        0x27b70a85, 0x2e1b2138, 0x4d2c6dfc, 0x53380d13,
        0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
        0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3,
        0xd192e819, 0xd6990624, 0xf40e3585, 0x106aa070,
        0x19a4c116, 0x1e376c08, 0x2748774c, 0x34b0bcb5,
        0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f, 0x682e6ff3,
        0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
        0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
    };

    // Convert the first 16 words from big endian to host byte order.
    uint8_t index;
    for (index = 0; index < 16; ++index)
        state.w[index] = be32toh(state.w[index]);

    // Initialise working variables to the current hash value.
    uint32_t a = state.h[0];
    uint32_t b = state.h[1];
    uint32_t c = state.h[2];
    uint32_t d = state.h[3];
    uint32_t e = state.h[4];
    uint32_t f = state.h[5];
    uint32_t g = state.h[6];
    uint32_t h = state.h[7];

    // Perform the first 16 rounds of the compression function main loop.
    uint32_t temp1, temp2;
    for (index = 0; index < 16; ++index) {
        temp1 = h + pgm_read_dword(k + index) + state.w[index] +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Perform the 48 remaining rounds.  We expand the first 16 words to
    // 64 in-place in the "w" array.  This saves 192 bytes of memory
    // that would have otherwise need to be allocated to the "w" array.
    for (; index < 64; ++index) {
        // Expand the next word.
        temp1 = state.w[(index - 15) & 0x0F];
        temp2 = state.w[(index - 2) & 0x0F];
        temp1 = state.w[index & 0x0F] =
            state.w[(index - 16) & 0x0F] + state.w[(index - 7) & 0x0F] +
                (rightRotate7(temp1) ^ rightRotate18(temp1) ^ (temp1 >> 3)) +
                (rightRotate17(temp2) ^ rightRotate19(temp2) ^ (temp2 >> 10));

        // Perform the round.
        temp1 = h + pgm_read_dword(k + index) + temp1 +
                (rightRotate6(e) ^ rightRotate11(e) ^ rightRotate25(e)) +
                ((e & f) ^ ((~e) & g));
        temp2 = (rightRotate2(a) ^ rightRotate13(a) ^ rightRotate22(a)) +
                ((a & b) ^ (a & c) ^ (b & c));
        h = g;
        g = f;
        f = e;
        e = d + temp1;
        d = c;
        c = b;
        b = a;
        a = temp1 + temp2;
    }

    // Add the compressed chunk to the current hash value.
    state.h[0] += a;
    state.h[1] += b;
    state.h[2] += c;
    state.h[3] += d;
    state.h[4] += e;
    state.h[5] += f;
    state.h[6] += g;
    state.h[7] += h;

    // Attempt to clean up the stack.
    a = b = c = d = e = f = g = h = temp1 = temp2 = 0;
}